

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::tuple_caster<std::pair,bool,unsigned_long>::
       cast_impl<std::pair<bool,unsigned_long>,0ul,1ul>(char *src)

{
  undefined8 uVar1;
  long lVar2;
  handle hVar3;
  array<pybind11::object,_2UL> *__range3;
  array<pybind11::object,_2UL> entries;
  tuple result;
  object local_28 [2];
  handle local_18;
  
  if (*src == '\0') {
    local_28[0].super_handle.m_ptr = (handle)&_Py_FalseStruct;
  }
  else {
    local_28[0].super_handle.m_ptr = (handle)&_Py_TrueStruct;
  }
  ((PyObject *)local_28[0].super_handle.m_ptr)->ob_refcnt =
       ((PyObject *)local_28[0].super_handle.m_ptr)->ob_refcnt + 1;
  local_28[1].super_handle.m_ptr = (handle)PyLong_FromSize_t(*(undefined8 *)(src + 8));
  hVar3.m_ptr = (PyObject *)0x0;
  lVar2 = 0;
  do {
    if (*(long *)((long)&local_28[0].super_handle.m_ptr + lVar2) == 0) goto LAB_001f7ea3;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  tuple::tuple((tuple *)&local_18,2);
  hVar3.m_ptr = local_18.m_ptr;
  lVar2 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_28[0].super_handle.m_ptr + lVar2);
    *(undefined8 *)((long)&local_28[0].super_handle.m_ptr + lVar2) = 0;
    *(undefined8 *)((long)&local_18.m_ptr[1].ob_type + lVar2) = uVar1;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  local_18.m_ptr = (PyObject *)0x0;
  object::~object((object *)&local_18);
LAB_001f7ea3:
  lVar2 = 8;
  do {
    object::~object((object *)((long)&local_28[0].super_handle.m_ptr + lVar2));
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  return (handle)hVar3.m_ptr;
}

Assistant:

static handle cast(bool src, return_value_policy /* policy */, handle /* parent */) {
        return handle(src ? Py_True : Py_False).inc_ref();
    }